

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O1

void fiobj_dealloc_task(FIOBJ o,void *stack_)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  
  if ((((o & 1) == 0) && (o != 0)) && (uVar5 = (uint)o & 6, uVar5 != 6)) {
    pbVar4 = (byte *)(o & 0xfffffffffffffff8);
    LOCK();
    pbVar1 = pbVar4 + 4;
    *(int *)pbVar1 = *(int *)pbVar1 + -1;
    UNLOCK();
    if (*(int *)pbVar1 == 0) {
      bVar3 = (byte)o;
      if (o == 0 || (o & 1) != 0) {
        bVar2 = (o == 0) * '\x05' + 1;
      }
      else {
        switch(uVar5) {
        case 0:
          bVar2 = *pbVar4;
          break;
        case 2:
          bVar2 = 0x28;
          break;
        case 4:
          bVar2 = 0x2a;
          break;
        case 6:
          bVar2 = bVar3;
        }
      }
      if (bVar2 - 0x27 < 5) {
        (*(code *)(&DAT_0016848c + *(int *)(&DAT_0016848c + (ulong)(bVar2 - 0x27) * 4)))();
        return;
      }
      if ((o & 1) == 0 && o != 0) {
        switch(uVar5) {
        case 0:
          bVar3 = *pbVar4;
          break;
        case 2:
          bVar3 = 0x28;
          break;
        case 4:
          bVar3 = 0x2a;
          break;
        case 6:
        }
      }
      else {
        bVar3 = (o == 0) * '\x05' + 1;
      }
      if (bVar3 - 0x27 < 5) {
        (*(code *)(&DAT_001684ec + *(int *)(&DAT_001684ec + (ulong)(bVar3 - 0x27) * 4)))();
        return;
      }
      fio_free((void *)(o & 0xfffffffffffffff8));
      return;
    }
  }
  return;
}

Assistant:

static void fiobj_dealloc_task(FIOBJ o, void *stack_) {
  // if (!o)
  //   fprintf(stderr, "* WARN: freeing a NULL no-object\n");
  // else
  //   fprintf(stderr, "* freeing object %s\n", fiobj_obj2cstr(o).data);
  if (!o || !FIOBJ_IS_ALLOCATED(o))
    return;
  if (OBJREF_REM(o))
    return;
  if (!FIOBJECT2VTBL(o)->each || !FIOBJECT2VTBL(o)->count(o)) {
    FIOBJECT2VTBL(o)->dealloc(o, NULL, NULL);
    return;
  }
  fiobj_stack_s *s = stack_;
  fiobj_stack_push(s, o);
}